

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  long lVar1;
  ulong uVar2;
  DependenceStruct *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  lVar1 = std::__cxx11::string::find((char)this,0x2d);
  if (lVar1 == -1) {
    if (((this->Compare).Type != 0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":");
  }
  if ((this->Compare).Type == 3) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<=");
  }
  else if ((this->Compare).Type == 5) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">=");
  }
  else if ((this->Compare).Type == 2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"<");
  }
  else if ((this->Compare).Type == 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"=");
  }
  else if ((this->Compare).Type == 4) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,">");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)&(this->Compare).Value);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  std::string result = this->Name;
  if (this->Name.find('-') != std::string::npos) {
    // When a name contains a hyphen, we must use a colon after the name to
    // prevent the hyphen from being parsed by QtIFW as the separator between
    // the name and the version. Note that a colon is only supported with
    // QtIFW 3.1 or later.
    result += ":";
  } else if (this->Compare.Type != cmCPackIFWPackage::CompareNone ||
             !this->Compare.Value.empty()) {
    // No hyphen in the name and we know a version part will follow. Use a
    // hyphen as a separator since this works for all QtIFW versions.
    result += "-";
  }

  if (this->Compare.Type == cmCPackIFWPackage::CompareLessOrEqual) {
    result += "<=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreaterOrEqual) {
    result += ">=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareLess) {
    result += "<";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareEqual) {
    result += "=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreater) {
    result += ">";
  }

  result += this->Compare.Value;

  return result;
}